

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowererMDArch.cpp
# Opt level: O0

bool __thiscall
LowererMDArch::EmitLoadInt32
          (LowererMDArch *this,Instr *instrLoad,bool conversionFromObjectAllowed,
          bool bailOutOnHelper,LabelInstr *labelBailOut)

{
  LowererMD *this_00;
  code *pcVar1;
  bool bVar2;
  IRType IVar3;
  bool bVar4;
  bool bVar5;
  uint sourceContextId;
  uint functionId;
  BailOutKind BVar6;
  Opnd *pOVar7;
  undefined4 *puVar8;
  Opnd *pOVar9;
  LabelInstr *this_01;
  Instr *pIVar10;
  undefined8 uVar11;
  RejitException *this_02;
  BranchInstr *instr;
  RegOpnd *pRVar12;
  LabelInstr *local_e0;
  RegOpnd *floatOpnd;
  RegOpnd *src132;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_6c;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_6a;
  bool doFloatToIntFastPath;
  ValueType src1ValueType;
  LabelInstr *pLStack_68;
  RegOpnd *r1;
  LabelInstr *done;
  LabelInstr *labelFloat;
  LabelInstr *helper;
  RegOpnd *src1;
  Opnd *dst;
  bool isNotInt;
  bool isInt;
  LabelInstr *labelBailOut_local;
  bool bailOutOnHelper_local;
  bool conversionFromObjectAllowed_local;
  Instr *instrLoad_local;
  LowererMDArch *this_local;
  
  pOVar7 = IR::Instr::GetSrc1(instrLoad);
  bVar2 = IR::Opnd::IsRegOpnd(pOVar7);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0xa74,"(instrLoad->GetSrc1()->IsRegOpnd())",
                       "instrLoad->GetSrc1()->IsRegOpnd()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  pOVar7 = IR::Instr::GetSrc1(instrLoad);
  IVar3 = IR::Opnd::GetType(pOVar7);
  if (IVar3 != TyVar) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0xa75,"(instrLoad->GetSrc1()->GetType() == TyVar)",
                       "instrLoad->GetSrc1()->GetType() == TyVar");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  dst._6_1_ = false;
  pOVar7 = IR::Instr::GetDst(instrLoad);
  pOVar9 = IR::Instr::GetSrc1(instrLoad);
  helper = (LabelInstr *)IR::Opnd::AsRegOpnd(pOVar9);
  labelFloat = (LabelInstr *)0x0;
  done = (LabelInstr *)0x0;
  r1 = (RegOpnd *)0x0;
  bVar2 = IR::Opnd::IsTaggedInt((Opnd *)helper);
  if (!bVar2) {
    dst._6_1_ = IR::Opnd::IsNotInt((Opnd *)helper);
  }
  pOVar9 = IR::Instr::GetDst(instrLoad);
  bVar4 = IR::Opnd::IsEqual((Opnd *)helper,pOVar9);
  if (!bVar4) {
    this_01 = (LabelInstr *)IR::RegOpnd::New(TyVar,instrLoad->m_func);
    pLStack_68 = this_01;
    local_6a.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         IR::Opnd::GetValueType((Opnd *)helper);
    IR::Opnd::SetValueType((Opnd *)this_01,(ValueType)local_6a.field_0);
    pIVar10 = IR::Instr::New(MOV,(Opnd *)pLStack_68,(Opnd *)helper,instrLoad->m_func);
    IR::Instr::InsertBefore(instrLoad,pIVar10);
    helper = pLStack_68;
  }
  local_6c.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       IR::Opnd::GetValueType((Opnd *)helper);
  bVar4 = ValueType::IsLikelyFloat((ValueType *)&local_6c.field_0);
  if (!bVar4) {
    bVar5 = ValueType::IsLikelyUntaggedInt((ValueType *)&local_6c.field_0);
    bVar4 = false;
    if (!bVar5) goto LAB_00879243;
  }
  bVar5 = IR::Instr::HasBailOutInfo(instrLoad);
  bVar4 = false;
  if (bVar5) {
    BVar6 = IR::Instr::GetBailOutKind(instrLoad);
    bVar4 = true;
    if (BVar6 != BailOutIntOnly) {
      BVar6 = IR::Instr::GetBailOutKind(instrLoad);
      bVar4 = BVar6 == BailOutExpectingInteger;
    }
  }
  bVar4 = (bool)(bVar4 ^ 1);
LAB_00879243:
  if (dst._6_1_ == false) {
    if (!bVar2) {
      if (bVar4) {
        done = IR::LabelInstr::New(Label,instrLoad->m_func,false);
      }
      else {
        labelFloat = IR::LabelInstr::New(Label,instrLoad->m_func,true);
      }
      if (done == (LabelInstr *)0x0) {
        local_e0 = labelFloat;
      }
      else {
        local_e0 = done;
      }
      LowererMD::GenerateSmIntTest
                (this->lowererMD,(Opnd *)helper,instrLoad,local_e0,(Instr **)0x0,false);
    }
    pOVar9 = IR::Opnd::UseWithNewType((Opnd *)helper,TyInt32,instrLoad->m_func);
    pRVar12 = IR::Opnd::AsRegOpnd(pOVar9);
    pOVar7 = IR::Opnd::UseWithNewType(pOVar7,TyInt32,instrLoad->m_func);
    pIVar10 = IR::Instr::New(MOV_TRUNC,pOVar7,&pRVar12->super_Opnd,instrLoad->m_func);
    IR::Instr::InsertBefore(instrLoad,pIVar10);
    if (!bVar2) {
      r1 = (RegOpnd *)IR::Instr::GetOrCreateContinueLabel(instrLoad,false);
      instr = IR::BranchInstr::New(JMP,(LabelInstr *)r1,this->m_func);
      IR::Instr::InsertBefore(instrLoad,&instr->super_Instr);
    }
  }
  else if ((!bVar4) && (bailOutOnHelper)) {
    bVar2 = GlobOpt::DoEliminateArrayAccessHelperCall(this->m_func);
    if (bVar2) {
      this_02 = (RejitException *)__cxa_allocate_exception(1);
      Js::RejitException::RejitException(this_02,ArrayAccessHelperCallEliminationDisabled);
      __cxa_throw(this_02,&Js::RejitException::typeinfo,0);
    }
    sourceContextId = Func::GetSourceContextId(this->m_func);
    functionId = Func::GetLocalFunctionId(this->m_func);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,BailOutPhase,sourceContextId,functionId);
    if (bVar2) {
      Output::Print(L"    Aborting JIT because EliminateArrayAccessHelperCall is already off\n");
      Output::Flush();
    }
    uVar11 = __cxa_allocate_exception(1);
    __cxa_throw(uVar11,&Js::OperationAbortedException::typeinfo,0);
  }
  if (bVar2) {
    IR::Instr::Remove(instrLoad);
  }
  else {
    if (bVar4) {
      if (done != (LabelInstr *)0x0) {
        IR::Instr::InsertBefore(instrLoad,&done->super_Instr);
      }
      if (labelFloat == (LabelInstr *)0x0) {
        labelFloat = IR::LabelInstr::New(Label,instrLoad->m_func,true);
      }
      if (r1 == (RegOpnd *)0x0) {
        r1 = (RegOpnd *)IR::Instr::GetOrCreateContinueLabel(instrLoad,false);
      }
      pRVar12 = LowererMD::CheckFloatAndUntag
                          (this->lowererMD,(RegOpnd *)helper,instrLoad,labelFloat);
      this_00 = this->lowererMD;
      pOVar7 = IR::Instr::GetDst(instrLoad);
      LowererMD::ConvertFloatToInt32
                (this_00,pOVar7,&pRVar12->super_Opnd,labelFloat,(LabelInstr *)r1,instrLoad);
    }
    if (labelFloat != (LabelInstr *)0x0) {
      IR::Instr::InsertBefore(instrLoad,&labelFloat->super_Instr);
    }
    bVar2 = IR::Instr::HasBailOutInfo(instrLoad);
    if ((bVar2) &&
       ((BVar6 = IR::Instr::GetBailOutKind(instrLoad), BVar6 == BailOutIntOnly ||
        (BVar6 = IR::Instr::GetBailOutKind(instrLoad), BVar6 == BailOutExpectingInteger)))) {
      Lowerer::LoadInt32FromUntaggedVar(this->lowererMD->m_lowerer,instrLoad);
      return true;
    }
    if (bailOutOnHelper) {
      if (labelBailOut == (LabelInstr *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                           ,0xb09,"(labelBailOut)","labelBailOut");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      Lowerer::InsertBranch(Br,labelBailOut,instrLoad);
      IR::Instr::Remove(instrLoad);
    }
    else if (conversionFromObjectAllowed) {
      Lowerer::LowerUnaryHelperMem
                (this->lowererMD->m_lowerer,instrLoad,HelperConv_ToInt32,(Opnd *)0x0);
    }
    else {
      Lowerer::LowerUnaryHelperMemWithBoolReference
                (this->lowererMD->m_lowerer,instrLoad,HelperConv_ToInt32_NoObjects,true);
    }
  }
  return false;
}

Assistant:

bool
LowererMDArch::EmitLoadInt32(IR::Instr *instrLoad, bool conversionFromObjectAllowed, bool bailOutOnHelper, IR::LabelInstr * labelBailOut)
{
    //
    //    r1 = MOV src1
    // rtest = MOV src1
    //         SHR rtest, AtomTag_Shift
    //         CMP rtest, 1
    //         JNE $helper or $float
    // r_dst = MOV_TRUNC e_src1
    //         JMP $done
    //  $float:
    //     dst = ConvertToFloat(r1, $helper)
    // $helper:
    // r_dst = ToInt32()
    //

    Assert(instrLoad->GetSrc1()->IsRegOpnd());
    Assert(instrLoad->GetSrc1()->GetType() == TyVar);

    // TODO: Fix bad lowering. We shouldn't see TyVars here.
    // Assert(instrLoad->GetDst()->GetType() == TyInt32);

    bool isInt             = false;
    bool isNotInt          = false;
    IR::Opnd *dst          = instrLoad->GetDst();
    IR::RegOpnd *src1      = instrLoad->GetSrc1()->AsRegOpnd();
    IR::LabelInstr *helper = nullptr;
    IR::LabelInstr *labelFloat = nullptr;
    IR::LabelInstr *done   = nullptr;

    if (src1->IsTaggedInt())
    {
        isInt = true;
    }
    else if (src1->IsNotInt())
    {
        isNotInt = true;
    }

    if (src1->IsEqual(instrLoad->GetDst()) == false)
    {
        // r1 = MOV src1
        IR::RegOpnd *r1 = IR::RegOpnd::New(TyVar, instrLoad->m_func);
        r1->SetValueType(src1->GetValueType());
        instrLoad->InsertBefore(IR::Instr::New(Js::OpCode::MOV, r1, src1, instrLoad->m_func));
        src1 = r1;
    }

    const ValueType src1ValueType(src1->GetValueType());
    const bool doFloatToIntFastPath =
        (src1ValueType.IsLikelyFloat() || src1ValueType.IsLikelyUntaggedInt()) &&
                !(instrLoad->HasBailOutInfo() && (instrLoad->GetBailOutKind() == IR::BailOutIntOnly || instrLoad->GetBailOutKind() == IR::BailOutExpectingInteger));

    if (isNotInt)
    {
        // Known to be non-integer. If we are required to bail out on helper call, just re-jit.
        if (!doFloatToIntFastPath && bailOutOnHelper)
        {
            if(!GlobOpt::DoEliminateArrayAccessHelperCall(this->m_func))
            {
                // Array access helper call removal is already off for some reason. Prevent trying to rejit again
                // because it won't help and the same thing will happen again. Just abort jitting this function.
                if(PHASE_TRACE(Js::BailOutPhase, this->m_func))
                {
                    Output::Print(_u("    Aborting JIT because EliminateArrayAccessHelperCall is already off\n"));
                    Output::Flush();
                }
                throw Js::OperationAbortedException();
            }

            throw Js::RejitException(RejitReason::ArrayAccessHelperCallEliminationDisabled);
        }
    }
    else
    {
        // It could be an integer in this case.
        if (!isInt)
        {
            if(doFloatToIntFastPath)
            {
                labelFloat = IR::LabelInstr::New(Js::OpCode::Label, instrLoad->m_func, false);
            }
            else
            {
                helper = IR::LabelInstr::New(Js::OpCode::Label, instrLoad->m_func, true);
            }

            this->lowererMD->GenerateSmIntTest(src1, instrLoad, labelFloat ? labelFloat : helper);
        }
        IR::RegOpnd *src132 = src1->UseWithNewType(TyInt32, instrLoad->m_func)->AsRegOpnd();
#if !INT32VAR
        // src1 = SAR src1, VarTag_Shift
        instrLoad->InsertBefore(IR::Instr::New(Js::OpCode::SAR,
                                               src132,
                                               src132,
                                               IR::IntConstOpnd::New(Js::VarTag_Shift, TyInt8, instrLoad->m_func),
                                               instrLoad->m_func));

        // r_dst = MOV src1
        // This is only a MOV (and not a MOVSXD) because we do a signed shift right, but we'll copy
        // all 64 bits.


        instrLoad->InsertBefore(IR::Instr::New(Js::OpCode::MOV,
                                               dst->UseWithNewType(TyMachReg, instrLoad->m_func),
                                               src1,
                                               instrLoad->m_func));

#else

        instrLoad->InsertBefore(IR::Instr::New(Js::OpCode::MOV_TRUNC,
                                               dst->UseWithNewType(TyInt32, instrLoad->m_func),
                                               src132,
                                               instrLoad->m_func));
#endif
        if (!isInt)
        {
            // JMP $done
            done = instrLoad->GetOrCreateContinueLabel();
            instrLoad->InsertBefore(IR::BranchInstr::New(Js::OpCode::JMP, done, m_func));
        }
    }

    if (!isInt)
    {
        if(doFloatToIntFastPath)
        {
            if(labelFloat)
            {
                instrLoad->InsertBefore(labelFloat);
            }
            if(!helper)
            {
                helper = IR::LabelInstr::New(Js::OpCode::Label, instrLoad->m_func, true);
            }

            if(!done)
            {
                done = instrLoad->GetOrCreateContinueLabel();
            }
#if FLOATVAR
            IR::RegOpnd* floatOpnd = this->lowererMD->CheckFloatAndUntag(src1, instrLoad, helper);
#else
            this->lowererMD->GenerateFloatTest(src1, instrLoad, helper, instrLoad->HasBailOutInfo());
            IR::IndirOpnd* floatOpnd = IR::IndirOpnd::New(src1, Js::JavascriptNumber::GetValueOffset(), TyMachDouble, this->m_func);
#endif
            this->lowererMD->ConvertFloatToInt32(instrLoad->GetDst(), floatOpnd, helper, done, instrLoad);
        }

        // $helper:
        if (helper)
        {
            instrLoad->InsertBefore(helper);
        }
        if(instrLoad->HasBailOutInfo() && (instrLoad->GetBailOutKind() == IR::BailOutIntOnly || instrLoad->GetBailOutKind() == IR::BailOutExpectingInteger))
        {
            // Avoid bailout if we have a JavascriptNumber whose value is a signed 32-bit integer
            lowererMD->m_lowerer->LoadInt32FromUntaggedVar(instrLoad);

            // Need to bail out instead of calling a helper
            return true;
        }

        if (bailOutOnHelper)
        {
            Assert(labelBailOut);
            lowererMD->m_lowerer->InsertBranch(Js::OpCode::Br, labelBailOut, instrLoad);
            instrLoad->Remove();
        }
        else if (conversionFromObjectAllowed)
        {
            lowererMD->m_lowerer->LowerUnaryHelperMem(instrLoad, IR::HelperConv_ToInt32);
        }
        else
        {
            lowererMD->m_lowerer->LowerUnaryHelperMemWithBoolReference(instrLoad, IR::HelperConv_ToInt32_NoObjects, true /*useBoolForBailout*/);
        }
    }
    else
    {
        instrLoad->Remove();
    }

    return false;
}